

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O1

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AtanOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AtanOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AtanOp>_>
::tokenize(UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AtanOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AtanOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AtanOp>_>
           *this,GeneratorState *state,TokenStream *str)

{
  size_t sVar1;
  size_t sVar2;
  Token local_40;
  Token local_30;
  
  Token::Token(&local_40,(this->m_function)._M_dataplus._M_p);
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&str->m_tokens,str->m_numTokens + 0x40);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_40);
  sVar2 = str->m_numTokens;
  sVar1 = sVar2 + 1;
  str->m_numTokens = sVar1;
  local_30.m_type = LEFT_PAREN;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == sVar1) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x41);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
  Token::~Token(&local_40);
  (*this->m_child->_vptr_Expression[3])(this->m_child,state,str);
  local_40.m_type = RIGHT_PAREN;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&str->m_tokens,str->m_numTokens + 0x40);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_40);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_40);
  return;
}

Assistant:

void UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::tokenize (GeneratorState& state, TokenStream& str) const
{
	str << Token(m_function.c_str()) << Token::LEFT_PAREN;
	m_child->tokenize(state, str);
	str << Token::RIGHT_PAREN;
}